

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcg.c
# Opt level: O2

int tcg_gen_code_sparc(TCGContext_conflict7 *s,TranslationBlock *tb)

{
  TCGTemp **__s;
  ushort uVar1;
  TCGOp *pTVar2;
  TCGTemp *pTVar3;
  TCGOpDef *pTVar4;
  uint *puVar5;
  TCGArgConstraint *pTVar6;
  TCGLabelQemuLdst *pTVar7;
  uintptr_t value;
  byte bVar8;
  tcg_insn_unit tVar9;
  _Bool _Var10;
  TCGOpcode TVar11;
  TCGReg TVar12;
  int iVar13;
  char *pcVar14;
  ulong uVar15;
  TCGOp *pTVar16;
  ulong uVar17;
  ulong uVar18;
  long lVar19;
  TCGType_conflict *pTVar20;
  tcg_insn_unit *ptVar21;
  byte bVar22;
  TCGLifeData arg_life;
  uint uVar23;
  TCGRegSet TVar24;
  char cVar27;
  int _small;
  undefined1 *puVar25;
  undefined8 uVar26;
  TCGOpcode TVar28;
  TCGRegSet TVar29;
  TCGType_conflict base;
  TCGType_conflict r;
  ulong uVar30;
  void **ppvVar31;
  TCGTemp *pTVar32;
  tcg_target_ulong val;
  TCGLabel *pTVar33;
  TCGOp *pTVar34;
  anon_struct_16_2_9a852307_for_labels *paVar35;
  uint uVar36;
  TCGRegSet allocated_regs;
  uint allocated_regs_00;
  TCGArg TVar37;
  TCGType_conflict TVar38;
  TCGType_conflict TVar39;
  TCGCond cond;
  ulong uVar40;
  long lVar41;
  TCGArg TVar42;
  TCGType_conflict TVar43;
  TCGType_conflict TVar45;
  uint uVar46;
  anon_union_16_2_aaf24f3d_for_link *paVar47;
  TCGRegSet preferred_regs;
  TCGType_conflict TVar48;
  TCGType_conflict TVar49;
  int iVar50;
  long lVar51;
  anon_struct_16_2_9a852307_for_ldst_labels *paVar52;
  tcg_insn_unit tVar53;
  uint uVar54;
  long lVar55;
  tcg_insn_unit **pptVar56;
  TCGRelocation *pTVar57;
  bool bVar58;
  target_ulong_conflict atVar59 [2];
  tcg_target_long tStackY_180;
  TCGArg TVar60;
  uint local_12c;
  TCGArg new_args [16];
  int local_78 [4];
  int local_68;
  int local_64;
  TCGType_conflict TVar44;
  TCGType_conflict rexw;
  
  pcVar14 = getenv("UNICORN_DEBUG");
  if (pcVar14 != (char *)0x0) {
    tcg_dump_ops_sparc(s,false,"TCG before optimization:");
  }
  tcg_optimize_sparc(s);
  paVar47 = (anon_union_16_2_aaf24f3d_for_link *)&s->ops;
  pTVar2 = (s->ops).tqh_first;
  bVar22 = 0;
LAB_008b60b7:
  do {
    pTVar34 = pTVar2;
    if (pTVar34 == (TCGOp *)0x0) break;
    pTVar2 = (pTVar34->link).tqe_next;
    uVar36 = *(uint *)pTVar34;
    if ((char)uVar36 != -0x7f) {
      uVar23 = uVar36 & 0xff;
      if (uVar23 == 0x84) {
LAB_008b6138:
        bVar8 = 1;
LAB_008b6159:
        bVar58 = bVar22 == 0;
        bVar22 = bVar8;
        if (bVar58) goto LAB_008b60b7;
      }
      else {
        if (uVar23 == 2) {
          bVar8 = ((byte)pTVar34->args[(ulong)((uVar36 >> 8 & 0xf) + (uVar36 >> 0xc & 0xf)) + 1] & 8
                  ) >> 3 | bVar22;
          goto LAB_008b6159;
        }
        if ((uVar23 == 3) || (uVar23 == 0x82)) goto LAB_008b6138;
        bVar8 = bVar22;
        if (uVar23 != 1) goto LAB_008b6159;
        uVar36 = *(uint *)pTVar34->args[0];
        if (0xffff < uVar36) {
          bVar22 = 0;
          if ((uVar36 & 0xffff0000) != 0x10000) goto LAB_008b60b7;
          pTVar16 = (TCGOp *)((pTVar34->link).tqe_circ.tql_prev)->tql_prev->tql_next;
          bVar22 = 0;
          if ((*(char *)pTVar16 != '\x03') ||
             (bVar22 = 0, (uint *)pTVar34->args[0] != (uint *)pTVar16->args[0])) goto LAB_008b60b7;
          tcg_op_remove_sparc(s,pTVar16);
          bVar8 = 0;
        }
      }
      tcg_op_remove_sparc(s,pTVar34);
      bVar22 = bVar8;
    }
  } while( true );
  liveness_pass_1(s);
  if (0 < s->nb_indirects) {
    uVar30 = 0;
    uVar15 = (ulong)(uint)s->nb_globals;
    if (s->nb_globals < 1) {
      uVar15 = uVar30;
    }
    for (; uVar15 * 0x38 - uVar30 != 0; uVar30 = uVar30 + 0x38) {
      if (((&s->temps[0].field_0x4)[uVar30] & 2) == 0) {
        pTVar32 = (TCGTemp *)0x0;
      }
      else {
        iVar50 = s->nb_temps;
        s->nb_temps = iVar50 + 1;
        pTVar32 = s->temps + iVar50;
        s->temps[iVar50].name = (char *)0x0;
        s->temps[iVar50].state = 0;
        s->temps[iVar50].mem_base = (TCGTemp *)0x0;
        s->temps[iVar50].mem_offset = 0;
        s->temps[iVar50].state_ptr = (void *)0x0;
        *(undefined1 (*) [16])(s->temps + iVar50) = (undefined1  [16])0x0;
        lVar19 = (ulong)(byte)(&s->temps[0].field_0x3)[uVar30] << 0x18;
        *(long *)(s->temps + iVar50) = lVar19;
        *(ulong *)(s->temps + iVar50) =
             (ulong)((uint)(byte)(&s->temps[0].field_0x2)[uVar30] << 0x10 | (uint)lVar19);
      }
      *(TCGTemp **)((long)&s->temps[0].state_ptr + uVar30) = pTVar32;
      *(undefined8 *)((long)&s->temps[0].state + uVar30) = 1;
    }
    iVar50 = s->nb_temps;
    ppvVar31 = &s->temps[uVar15].state_ptr;
    for (; (long)uVar15 < (long)iVar50; uVar15 = uVar15 + 1) {
      *ppvVar31 = (void *)0x0;
      ppvVar31[-1] = (void *)0x1;
      ppvVar31 = ppvVar31 + 7;
    }
    bVar58 = false;
    pTVar2 = (s->ops).tqh_first;
    while (pTVar34 = pTVar2, pTVar34 != (TCGOp *)0x0) {
      uVar36 = *(uint *)pTVar34;
      if ((uVar36 & 0xff) == 2) {
        uVar23 = uVar36 >> 0xc & 0xf;
        uVar46 = uVar36 >> 8 & 0xf;
      }
      else {
        uVar23 = (uVar36 & 0xff) << 5;
        uVar46 = (uint)(&s->tcg_op_defs->nb_iargs)[uVar23];
        uVar23 = (uint)(&s->tcg_op_defs->nb_oargs)[uVar23];
      }
      pTVar2 = (pTVar34->link).tqe_next;
      uVar36 = uVar36 >> 0x10;
      uVar30 = (ulong)uVar23;
      for (uVar15 = uVar30; uVar18 = uVar30, uVar15 < uVar46 + uVar23; uVar15 = uVar15 + 1) {
        TVar37 = pTVar34->args[uVar15];
        if (((TVar37 != 0) && (TVar60 = *(TCGArg *)(TVar37 + 0x30), TVar60 != 0)) &&
           (*(long *)(TVar37 + 0x28) == 1)) {
          TVar28 = INDEX_op_ld_i32;
          if (*(char *)(TVar37 + 3) != '\0') {
            TVar28 = INDEX_op_ld_i64;
          }
          pTVar16 = tcg_op_insert_before_sparc(s,pTVar34,TVar28);
          pTVar16->args[0] = TVar60;
          pTVar16->args[1] = *(TCGArg *)(TVar37 + 0x10);
          pTVar16->args[2] = *(TCGArg *)(TVar37 + 0x18);
          *(undefined8 *)(TVar37 + 0x28) = 2;
        }
      }
      for (; uVar18 < uVar46 + uVar23; uVar18 = uVar18 + 1) {
        TVar37 = pTVar34->args[uVar18];
        if ((TVar37 != 0) && (*(TCGArg *)(TVar37 + 0x30) != 0)) {
          pTVar34->args[uVar18] = *(TCGArg *)(TVar37 + 0x30);
          bVar58 = true;
          if ((uVar36 >> ((byte)uVar18 & 0x1f) & 4) != 0) {
            *(undefined8 *)(TVar37 + 0x28) = 1;
          }
        }
      }
      for (uVar15 = 0; uVar30 != uVar15; uVar15 = uVar15 + 1) {
        TVar37 = pTVar34->args[uVar15];
        TVar60 = *(TCGArg *)(TVar37 + 0x30);
        if (TVar60 != 0) {
          pTVar34->args[uVar15] = TVar60;
          *(undefined8 *)(TVar37 + 0x28) = 0;
          if ((uVar36 >> ((uint)uVar15 & 0x1f) & 1) != 0) {
            TVar28 = INDEX_op_st_i32;
            if (*(char *)(TVar37 + 3) != '\0') {
              TVar28 = INDEX_op_st_i64;
            }
            pTVar16 = tcg_op_insert_after_sparc(s,pTVar34,TVar28);
            pTVar16->args[0] = TVar60;
            pTVar16->args[1] = *(TCGArg *)(TVar37 + 0x10);
            pTVar16->args[2] = *(TCGArg *)(TVar37 + 0x18);
            *(undefined8 *)(TVar37 + 0x28) = 2;
          }
          bVar58 = true;
          if ((uVar36 >> ((byte)uVar15 & 0x1f) & 4) != 0) {
            *(undefined8 *)(TVar37 + 0x28) = 1;
          }
        }
      }
    }
    if (bVar58) {
      liveness_pass_1(s);
    }
  }
  uVar30 = 0;
  uVar15 = (ulong)(uint)s->nb_globals;
  if (s->nb_globals < 1) {
    uVar15 = uVar30;
  }
  for (; uVar15 * 0x38 - uVar30 != 0; uVar30 = uVar30 + 0x38) {
    (&s->temps[0].field_0x1)[uVar30] =
         (char)((uint)((*(ulong *)(&s->temps[0].field_0x0 + uVar30) & 0x100000000) == 0) * 0x100 +
                0x100 >> 8);
  }
  iVar50 = s->nb_temps;
  pTVar32 = s->temps + uVar15;
  for (; (long)uVar15 < (long)iVar50; uVar15 = uVar15 + 1) {
    *(ulong *)pTVar32 =
         *(ulong *)pTVar32 & 0xffffffeeffff00ff | (ulong)((uint)(*(ulong *)pTVar32 >> 0x1d) & 0x200)
    ;
    pTVar32 = pTVar32 + 1;
  }
  __s = s->reg_to_temp;
  memset(__s,0,0x100);
  ptVar21 = *(tcg_insn_unit **)&tb->cflags;
  s->code_buf = ptVar21;
  s->code_ptr = ptVar21;
  paVar52 = &s->ldst_labels;
  (s->ldst_labels).sqh_first = (TCGLabelQemuLdst *)0x0;
  (s->ldst_labels).sqh_last = &paVar52->sqh_first;
  s->pool_labels = (TCGLabelPoolData *)0x0;
  pcVar14 = getenv("UNICORN_DEBUG");
  if (pcVar14 != (char *)0x0) {
    tcg_dump_ops_sparc(s,false,"TCG before codegen:");
  }
  local_12c = 0xffffffff;
LAB_008b64f6:
  pTVar2 = paVar47->tqe_next;
  if (pTVar2 == (TCGOp *)0x0) {
    ptVar21 = s->code_ptr;
    s->gen_insn_end_off[local_12c] = (short)ptVar21 - (short)*(undefined4 *)&s->code_buf;
    goto LAB_008b82c3;
  }
  TVar28 = *(TCGOpcode *)pTVar2;
  TVar11 = TVar28 & (INDEX_op_mulsh_i64|INDEX_op_muluh_i64);
  arg_life = (TCGLifeData)(TVar28 >> 0x10);
  switch(TVar11) {
  case INDEX_op_discard:
    pTVar32 = (TCGTemp *)pTVar2->args[0];
LAB_008b655e:
    temp_dead(s,pTVar32);
    goto LAB_008b6e2e;
  case INDEX_op_set_label:
    puVar5 = (uint *)pTVar2->args[0];
    ptVar21 = s->code_ptr;
    *puVar5 = *puVar5 | 2;
    *(tcg_insn_unit **)(puVar5 + 2) = ptVar21;
    goto LAB_008b6e2e;
  case INDEX_op_call:
    uVar23 = TVar28 >> 8 & 0xf;
    uVar36 = 6;
    if (uVar23 < 6) {
      uVar36 = uVar23;
    }
    lVar19 = (long)(int)(uVar23 - uVar36);
    if ((lVar19 * 8 + 0xfU & 0xfffffffffffffff0) < 0x81) {
      uVar54 = TVar28 >> 0xc & 0xf;
      uVar15 = (ulong)uVar54;
      uVar46 = TVar28 >> 0x10;
      ptVar21 = (tcg_insn_unit *)pTVar2->args[uVar54 + uVar23];
      lVar51 = 0;
      while (bVar58 = lVar19 != 0, lVar19 = lVar19 + -1, bVar58) {
        pTVar32 = *(TCGTemp **)((long)pTVar2->args + lVar51 + (ulong)(uVar36 + uVar54) * 8);
        if (pTVar32 != (TCGTemp *)0x0) {
          temp_load(s,pTVar32,s->tcg_target_available_regs[(byte)pTVar32->field_0x3],
                    s->reserved_regs,0);
          tcg_out_st(s,*(TCGReg *)pTVar32 >> 0x18,*(TCGReg *)pTVar32 & 0xff,TCG_REG_CALL_STACK,
                     lVar51);
        }
        lVar51 = lVar51 + 8;
      }
      allocated_regs_00 = s->reserved_regs;
      for (uVar30 = 0; uVar18 = uVar15, uVar36 << 2 != uVar30; uVar30 = uVar30 + 4) {
        pTVar32 = *(TCGTemp **)((long)pTVar2->args + uVar30 * 2 + uVar15 * 8);
        if (pTVar32 != (TCGTemp *)0x0) {
          TVar12 = *(TCGReg *)((long)tcg_target_call_iarg_regs + uVar30);
          if (((TCGReg)*(undefined8 *)pTVar32 & 0xff00) == 0x100) {
            if (((TCGReg)*(undefined8 *)pTVar32 & 0xff) != TVar12) {
              tcg_reg_free(s,TVar12,allocated_regs_00);
              tcg_out_mov(s,*(TCGReg *)pTVar32 >> 0x18,TVar12,*(TCGReg *)pTVar32 & 0xff);
            }
          }
          else {
            tcg_reg_free(s,TVar12,allocated_regs_00);
            temp_load(s,pTVar32,1 << ((byte)TVar12 & 0x1f),allocated_regs_00,0);
          }
          allocated_regs_00 = allocated_regs_00 | 1 << (TVar12 & TCG_REG_XMM15);
        }
      }
      for (; uVar18 < uVar54 + uVar23; uVar18 = uVar18 + 1) {
        if ((uVar46 >> ((byte)uVar18 & 0x1f) & 4) != 0) {
          temp_dead(s,(TCGTemp *)pTVar2->args[uVar18]);
        }
      }
      for (TVar12 = TCG_REG_EAX; TVar12 != 0x20; TVar12 = TVar12 + TCG_REG_ECX) {
        if ((s->tcg_target_call_clobber_regs >> (TVar12 & TCG_REG_XMM15) & 1) != 0) {
          tcg_reg_free(s,TVar12,allocated_regs_00);
        }
      }
      tcg_out_call(s,ptVar21);
      for (uVar30 = 0; uVar15 != uVar30; uVar30 = uVar30 + 1) {
        pTVar32 = (TCGTemp *)pTVar2->args[uVar30];
        uVar18 = *(ulong *)pTVar32;
        if (((uint)uVar18 & 0xff00) == 0x100) {
          __s[uVar18 & 0xff] = (TCGTemp *)0x0;
          uVar18 = *(ulong *)pTVar32;
        }
        *(ulong *)pTVar32 = uVar18 & 0xfffffff7ffff0000 | 0x100;
        *__s = pTVar32;
        uVar36 = 4 << ((byte)uVar30 & 0x1f) & uVar46;
        if ((uVar46 >> ((uint)uVar30 & 0x1f) & 1) == 0) {
          if (uVar36 != 0) {
            temp_dead(s,pTVar32);
          }
        }
        else {
          temp_sync(s,pTVar32,allocated_regs_00,0,uVar36);
        }
      }
      goto LAB_008b6e2e;
    }
    pcVar14 = 
    "/workspace/llm4binary/github/license_c_cmakelists/AFLplusplus[P]unicornafl/unicorn/qemu/tcg/tcg.c"
    ;
    uVar26 = 0xe1e;
    goto LAB_008b8515;
  case INDEX_op_br:
  case INDEX_op_mb:
switchD_008b6554_caseD_3:
    tcg_op_supported_sparc(TVar28 & (INDEX_op_mulsh_i64|INDEX_op_muluh_i64));
    uVar36 = TVar28 >> 0x10;
    pTVar4 = s->tcg_op_defs;
    uVar18 = (ulong)((TVar28 & (INDEX_op_mulsh_i64|INDEX_op_muluh_i64)) << 5);
    bVar22 = (&pTVar4->nb_oargs)[uVar18];
    uVar30 = (ulong)bVar22;
    bVar8 = (&pTVar4->nb_iargs)[uVar18];
    memcpy(new_args + (ulong)bVar22 + (ulong)bVar8,pTVar2->args + (ulong)bVar22 + (ulong)bVar8,
           (ulong)(&pTVar4->nb_cargs)[uVar18] << 3);
    TVar29 = s->reserved_regs;
    allocated_regs = TVar29;
    for (uVar15 = 0; uVar15 != bVar8; uVar15 = uVar15 + 1) {
      lVar19 = *(long *)((long)&pTVar4->args_ct + uVar18);
      lVar51 = *(long *)((long)&pTVar4->sorted_args + uVar18);
      iVar50 = *(int *)(lVar51 + uVar15 * 4 + uVar30 * 4);
      lVar55 = (long)iVar50;
      pTVar32 = (TCGTemp *)pTVar2->args[lVar55];
      uVar17 = *(ulong *)pTVar32;
      uVar23 = (uint)uVar17 & 0xff00;
      uVar1 = *(ushort *)(lVar19 + lVar55 * 8);
      if ((uVar23 == 0x300) &&
         ((((uVar40 = pTVar32->val, (uVar1 & 2) != 0 ||
            (((uVar1 >> 8 & 1) != 0 && (uVar40 + 0x80000000 >> 0x20 == 0)))) ||
           (((uVar1 >> 9 & 1) != 0 && (uVar40 >> 0x20 == 0)))) ||
          ((((uVar1 >> 10 & 1) != 0 && (uVar40 + 0x80000000 >> 0x20 == 0)) ||
           (((uVar1 >> 0xb & 1) != 0 &&
            ((ulong)((char)(uVar17 >> 0x18) != '\0') * 0x20 + 0x20 == uVar40)))))))) {
        local_78[lVar55] = 1;
        new_args[lVar55] = uVar40;
      }
      else {
        TVar24 = 0;
        if ((uVar1 & 0x40) == 0) {
          preferred_regs = 0;
LAB_008b67b5:
          temp_load(s,pTVar32,*(TCGRegSet *)(lVar19 + 4 + lVar55 * 8),allocated_regs,TVar24);
          uVar17 = *(ulong *)pTVar32;
          bVar22 = (byte)uVar17;
          if ((*(uint *)(lVar19 + 4 + lVar55 * 8) >> ((uint)uVar17 & 0x1f) & 1) == 0)
          goto LAB_008b67e9;
          TVar37 = uVar17 & 0xff;
        }
        else {
          bVar22 = *(byte *)(lVar19 + 2 + lVar55 * 8);
          preferred_regs = pTVar2->output_pref[bVar22];
          if ((uVar17 & 0x100000000) == 0) {
            if ((uVar36 >> ((byte)iVar50 & 0x1f) & 4) != 0) {
              TVar24 = preferred_regs;
              if (uVar23 == 0x100) {
                for (uVar40 = 0; uVar15 != uVar40; uVar40 = uVar40 + 1) {
                  lVar41 = (long)*(int *)(lVar51 + uVar30 * 4 + uVar40 * 4);
                  if (((*(byte *)(lVar19 + lVar41 * 8) & 0x40) != 0) &&
                     ((uVar17 & 0xff) == new_args[lVar41])) goto LAB_008b67e9;
                }
              }
              goto LAB_008b67b5;
            }
          }
          else if (pTVar32 == (TCGTemp *)pTVar2->args[bVar22]) goto LAB_008b67b5;
LAB_008b67e9:
          temp_load(s,pTVar32,s->tcg_target_available_regs[uVar17 >> 0x18 & 0xff],allocated_regs,0);
          TVar12 = tcg_reg_alloc(s,*(TCGRegSet *)(lVar19 + 4 + lVar55 * 8),allocated_regs,
                                 preferred_regs,
                                 ((undefined1  [56])*pTVar32 & (undefined1  [56])0x400000000) !=
                                 (undefined1  [56])0x0);
          TVar37 = (TCGArg)TVar12;
          tcg_out_mov(s,*(TCGReg *)pTVar32 >> 0x18,TVar12,*(TCGReg *)pTVar32 & 0xff);
          bVar22 = (byte)TVar12;
        }
        new_args[lVar55] = TVar37;
        local_78[lVar55] = 0;
        allocated_regs = allocated_regs | 1 << (bVar22 & 0x1f);
      }
    }
    for (uVar15 = uVar30; uVar15 < bVar8 + uVar30; uVar15 = uVar15 + 1) {
      if ((uVar36 >> ((byte)uVar15 & 0x1f) & 4) != 0) {
        temp_dead(s,(TCGTemp *)pTVar2->args[uVar15]);
      }
    }
    bVar22 = (&pTVar4->flags)[uVar18];
    if ((bVar22 & 2) == 0) {
      if ((bVar22 & 4) != 0) {
        for (TVar12 = TCG_REG_EAX; TVar12 != 0x20; TVar12 = TVar12 + TCG_REG_ECX) {
          if ((s->tcg_target_call_clobber_regs >> (TVar12 & TCG_REG_XMM15) & 1) != 0) {
            tcg_reg_free(s,TVar12,allocated_regs);
          }
        }
      }
      for (uVar15 = 0; uVar30 != uVar15; uVar15 = uVar15 + 1) {
        lVar19 = *(long *)((long)&pTVar4->args_ct + uVar18);
        lVar51 = (long)*(int *)(*(long *)((long)&pTVar4->sorted_args + uVar18) + uVar15 * 4);
        pTVar32 = (TCGTemp *)pTVar2->args[lVar51];
        uVar1 = *(ushort *)(lVar19 + lVar51 * 8);
        if (((char)uVar1 < '\0') &&
           (bVar22 = *(byte *)(lVar19 + 2 + lVar51 * 8), local_78[bVar22] == 0)) {
          TVar12 = *(TCGReg *)(new_args + bVar22);
        }
        else {
          if ((uVar1 & 0x20) == 0) {
            TVar24 = pTVar2->output_pref[uVar15];
            uVar23 = TVar29;
          }
          else {
            uVar23 = TVar29 | allocated_regs;
            TVar24 = pTVar2->output_pref[uVar15];
          }
          TVar12 = tcg_reg_alloc(s,*(TCGRegSet *)(lVar19 + 4 + lVar51 * 8),uVar23,TVar24,
                                 ((undefined1  [56])*pTVar32 & (undefined1  [56])0x400000000) !=
                                 (undefined1  [56])0x0);
        }
        uVar17 = *(ulong *)pTVar32;
        if (((uint)uVar17 & 0xff00) == 0x100) {
          __s[uVar17 & 0xff] = (TCGTemp *)0x0;
          uVar17 = *(ulong *)pTVar32;
        }
        TVar29 = TVar29 | 1 << (TVar12 & TCG_REG_XMM15);
        *(ulong *)pTVar32 = (uVar17 & 0xfffffff7ffff0000) + (ulong)(byte)TVar12 + 0x100;
        __s[TVar12] = pTVar32;
        new_args[lVar51] = (ulong)TVar12;
      }
      bVar22 = (&pTVar4->flags)[uVar18];
    }
    iVar50 = local_78[2];
    cond = (TCGCond)new_args[5];
    TVar38 = (TCGType_conflict)new_args[3];
    TVar60 = new_args[2];
    TVar37 = new_args[0];
    uVar23 = *(uint *)pTVar2;
    r = (TCGType_conflict)new_args[0];
    base = (TCGType_conflict)new_args[1];
    tVar9 = (tcg_insn_unit)new_args[2];
    TVar48 = (TCGType_conflict)new_args[2];
    if ((bVar22 & 0x40) != 0) {
      if (0x2b < (uVar23 & 0xff) - 0x8d) {
switchD_008b6f21_caseD_93:
        pcVar14 = 
        "/workspace/llm4binary/github/license_c_cmakelists/AFLplusplus[P]unicornafl/unicorn/qemu/tcg/i386/tcg-target.inc.c"
        ;
        iVar50 = 0xb75;
LAB_008b854c:
        g_assertion_message_expr(pcVar14,iVar50,(char *)0x0);
      }
      uVar46 = uVar23 >> 0xc & 0xf;
      TVar38 = (uVar23 >> 8 & 0xf) + TCG_TYPE_V64;
      uVar15 = (ulong)uVar46;
      iVar50 = 6;
      TVar37 = new_args[2];
      switch(uVar23 & 0xff) {
      case 0x8d:
        goto LAB_008b7dc4;
      case 0x8e:
        goto LAB_008b8202;
      case 0x8f:
        tcg_out_dupm_vec(s,TVar38,uVar46,r,base,new_args[2]);
        goto LAB_008b8141;
      case 0x90:
        TVar49 = *(TCGType_conflict *)(tcg_out_vec_op_add_insn + (ulong)uVar46 * 4);
        TVar48 = base;
        goto LAB_008b765f;
      case 0x91:
        puVar25 = tcg_out_vec_op_sub_insn;
        break;
      case 0x92:
        puVar25 = tcg_out_vec_op_mul_insn;
        break;
      default:
        goto switchD_008b6f21_caseD_93;
      case 0x94:
        TVar49 = *(TCGType_conflict *)(tcg_out_vec_op_abs_insn + uVar15 * 4);
        TVar37 = new_args[1];
        TVar48 = TCG_TYPE_I32;
        goto LAB_008b765f;
      case 0x95:
        puVar25 = tcg_out_vec_op_ssadd_insn;
        break;
      case 0x96:
        puVar25 = tcg_out_vec_op_usadd_insn;
        break;
      case 0x97:
        puVar25 = tcg_out_vec_op_sssub_insn;
        break;
      case 0x98:
        puVar25 = tcg_out_vec_op_ussub_insn;
        break;
      case 0x99:
        puVar25 = tcg_out_vec_op_smin_insn;
        break;
      case 0x9a:
        puVar25 = tcg_out_vec_op_umin_insn;
        break;
      case 0x9b:
        puVar25 = tcg_out_vec_op_smax_insn;
        break;
      case 0x9c:
        puVar25 = tcg_out_vec_op_umax_insn;
        break;
      case 0x9d:
        TVar49 = 0x5db;
        TVar48 = base;
        goto LAB_008b765f;
      case 0x9e:
        TVar49 = 0x5eb;
        TVar48 = base;
        goto LAB_008b765f;
      case 0x9f:
        TVar49 = 0x5ef;
        TVar48 = base;
        goto LAB_008b765f;
      case 0xa0:
        TVar39 = (uint)(TVar38 == TCG_TYPE_V256) << 0x13 | 0x5df;
        goto LAB_008b767c;
      case 0xa3:
        goto switchD_008b6f21_caseD_a3;
      case 0xa4:
        iVar50 = 2;
        goto switchD_008b6f21_caseD_a3;
      case 0xa5:
        iVar50 = 4;
switchD_008b6f21_caseD_a3:
        uVar23 = *(uint *)(tcg_out_vec_op_shift_imm_insn + uVar15 * 4) | 0x80000;
        if (TVar38 != TCG_TYPE_V256) {
          uVar23 = *(uint *)(tcg_out_vec_op_shift_imm_insn + uVar15 * 4);
        }
LAB_008b72cd:
        tcg_out_vex_modrm(s,uVar23,iVar50,r,base);
        ptVar21 = s->code_ptr;
        s->code_ptr = ptVar21 + 1;
        *ptVar21 = tVar9;
        goto LAB_008b8141;
      case 0xa6:
        puVar25 = tcg_out_vec_op_shls_insn;
        break;
      case 0xa7:
        puVar25 = tcg_out_vec_op_shrs_insn;
        break;
      case 0xa8:
        puVar25 = tcg_out_vec_op_sars_insn;
        break;
      case 0xa9:
        puVar25 = tcg_out_vec_op_shlv_insn;
        break;
      case 0xaa:
        puVar25 = tcg_out_vec_op_shrv_insn;
        break;
      case 0xab:
        puVar25 = tcg_out_vec_op_sarv_insn;
        break;
      case 0xac:
        if ((TCGType_conflict)new_args[3] == 0xb) {
          puVar25 = tcg_out_vec_op_cmpgt_insn;
        }
        else {
          if ((TCGType_conflict)new_args[3] != 8) {
            pcVar14 = 
            "/workspace/llm4binary/github/license_c_cmakelists/AFLplusplus[P]unicornafl/unicorn/qemu/tcg/i386/tcg-target.inc.c"
            ;
            iVar50 = 0xb20;
            goto LAB_008b854c;
          }
          puVar25 = tcg_out_vec_op_cmpeq_insn;
        }
        break;
      case 0xb0:
        uVar23 = 0x1c6;
        goto LAB_008b740d;
      case 0xb1:
        tcg_out_vex_modrm(s,(uint)(TVar38 == TCG_TYPE_V256) << 0x13 | 0x1044c,r,base,TVar48);
        tVar9 = (tcg_insn_unit)new_args[3] << 4;
        goto LAB_008b7979;
      case 0xb2:
        uVar23 = 0x1040e;
        if (uVar46 != 1) {
          if (uVar46 != 2) {
            pcVar14 = 
            "/workspace/llm4binary/github/license_c_cmakelists/AFLplusplus[P]unicornafl/unicorn/qemu/tcg/i386/tcg-target.inc.c"
            ;
            iVar50 = 0xb53;
            goto LAB_008b854c;
          }
          uVar23 = 0x1040c;
          if (have_avx2_sparc != false) {
            uVar23 = 0x10402;
          }
        }
        goto LAB_008b740d;
      case 0xb3:
        puVar25 = tcg_out_vec_op_packss_insn;
        break;
      case 0xb4:
        puVar25 = tcg_out_vec_op_packus_insn;
        break;
      case 0xb5:
        iVar50 = 3;
        uVar23 = 0x573;
        goto LAB_008b72cd;
      case 0xb6:
        uVar23 = 0x90446;
LAB_008b740d:
        tVar9 = (tcg_insn_unit)new_args[3];
        uVar46 = uVar23 | 0x80000;
        if (TVar38 != TCG_TYPE_V256) {
          uVar46 = uVar23;
        }
        tcg_out_vex_modrm(s,uVar46,r,base,TVar48);
        ptVar21 = s->code_ptr;
        s->code_ptr = ptVar21 + 1;
        *ptVar21 = tVar9;
        goto LAB_008b8141;
      case 0xb7:
        puVar25 = tcg_out_vec_op_punpckl_insn;
        break;
      case 0xb8:
        puVar25 = tcg_out_vec_op_punpckh_insn;
      }
      TVar49 = *(TCGType_conflict *)(puVar25 + uVar15 * 4);
      TVar48 = base;
LAB_008b765f:
      TVar39 = TVar49 | 0x80000;
      if (TVar38 != TCG_TYPE_V256) {
        TVar39 = TVar49;
      }
      base = (TCGType_conflict)TVar37;
LAB_008b767c:
      tcg_out_vex_modrm(s,TVar39,r,TVar48,base);
      goto LAB_008b8141;
    }
    uVar46 = (uVar23 & 0xff) - 3;
    if (0x85 < uVar46) {
switchD_008b6ebf_caseD_5:
      pcVar14 = 
      "/workspace/llm4binary/github/license_c_cmakelists/AFLplusplus[P]unicornafl/unicorn/qemu/tcg/i386/tcg-target.inc.c"
      ;
      uVar26 = 0xa57;
      goto LAB_008b8515;
    }
    break;
  case INDEX_op_mov_i32:
switchD_008b6554_caseD_5:
    uVar36 = s->reserved_regs;
    TVar29 = pTVar2->output_pref[0];
    pTVar32 = (TCGTemp *)pTVar2->args[0];
    pTVar3 = (TCGTemp *)pTVar2->args[1];
    TVar48 = (TCGType_conflict)(byte)pTVar32->field_0x3;
    uVar15 = *(ulong *)pTVar3;
    if ((char)(uVar15 >> 8) == '\x02') {
      temp_load(s,pTVar3,s->tcg_target_available_regs[uVar15 >> 0x18 & 0xff],uVar36,TVar29);
      uVar15 = *(ulong *)pTVar3;
    }
    else if (((uint)(uVar15 >> 8) & 0xff) == 3) {
      val = pTVar3->val;
      if ((TVar28 >> 0x13 & 1) != 0) {
        temp_dead(s,pTVar3);
      }
      goto LAB_008b6e24;
    }
    if ((TVar28 >> 0x12 & 1) == 0) {
      uVar30 = *(ulong *)pTVar32;
      uVar23 = (uint)uVar30 & 0xff00;
      if (((TVar28 >> 0x13 & 1) == 0) || ((uVar15 & 0x100000000) != 0)) {
        if (uVar23 != 0x100) {
          uVar36 = uVar36 | 1 << ((uint)uVar15 & 0x1f);
          TVar12 = tcg_reg_alloc(s,s->tcg_target_available_regs[TVar48],uVar36,TVar29,
                                 (uVar30 & 0x400000000) != 0);
          uVar30 = *(ulong *)pTVar32 & 0xffffffffffffff00 | (ulong)(TVar12 & 0xff);
          *(ulong *)pTVar32 = uVar30;
          uVar15 = *(ulong *)pTVar3;
        }
        tcg_out_mov(s,TVar48,(TCGReg)uVar30 & 0xff,(TCGReg)uVar15 & 0xff);
      }
      else {
        if (uVar23 == 0x100) {
          __s[uVar30 & 0xff] = (TCGTemp *)0x0;
          uVar15 = (ulong)*(byte *)pTVar3;
          uVar30 = *(ulong *)pTVar32;
        }
        *(ulong *)pTVar32 = uVar30 & 0xffffffffffffff00 | uVar15 & 0xff;
        temp_dead(s,pTVar3);
      }
      uVar15 = *(ulong *)pTVar32;
      *(ulong *)pTVar32 = uVar15 & 0xfffffff7ffff00ff | 0x100;
      __s[uVar15 & 0xff] = pTVar32;
      if ((TVar28 >> 0x10 & 1) != 0) {
        temp_sync(s,pTVar32,uVar36,0,0);
      }
    }
    else {
      if ((pTVar32->field_0x4 & 0x10) == 0) {
        temp_allocate_frame(s,pTVar32);
        uVar15 = *(ulong *)pTVar3;
      }
      tcg_out_st(s,TVar48,(TCGReg)uVar15 & 0xff,(uint)*(byte *)pTVar32->mem_base,pTVar32->mem_offset
                );
      if ((TVar28 >> 0x13 & 1) != 0) {
        temp_dead(s,pTVar3);
      }
      temp_dead(s,pTVar32);
    }
    goto LAB_008b6e2e;
  case INDEX_op_movi_i32:
switchD_008b6554_caseD_6:
    tcg_reg_alloc_do_movi
              (s,(TCGTemp *)pTVar2->args[0],pTVar2->args[1],arg_life,pTVar2->output_pref[0]);
    goto LAB_008b6e2e;
  default:
    if (TVar11 == INDEX_op_mov_i64) goto switchD_008b6554_caseD_5;
    if (TVar11 == INDEX_op_movi_i64) goto switchD_008b6554_caseD_6;
    if (TVar11 == INDEX_op_insn_start) {
      if ((-1 < (int)local_12c) &&
         (uVar15 = (long)s->code_ptr - (long)s->code_buf,
         s->gen_insn_end_off[local_12c] = (uint16_t)uVar15, 0xffff < uVar15)) {
        __assert_fail("s->gen_insn_end_off[num_insns] == off",
                      "/workspace/llm4binary/github/license_c_cmakelists/AFLplusplus[P]unicornafl/unicorn/qemu/tcg/tcg.c"
                      ,0xedf,"int tcg_gen_code_sparc(TCGContext *, TranslationBlock *)");
      }
      lVar19 = (long)(int)local_12c;
      local_12c = local_12c + 1;
      atVar59[1] = (target_ulong_conflict)pTVar2->args[1];
      atVar59[0] = (target_ulong_conflict)pTVar2->args[0];
      s->gen_insn_data[lVar19 + 1] = atVar59;
      goto LAB_008b6e2e;
    }
    if (TVar11 != INDEX_op_dup_vec) {
      if (TVar11 != INDEX_op_dupi_vec) {
        if (TVar11 != INDEX_op_mov_vec) goto switchD_008b6554_caseD_3;
        goto switchD_008b6554_caseD_5;
      }
      goto switchD_008b6554_caseD_6;
    }
    pTVar32 = (TCGTemp *)pTVar2->args[0];
    pTVar3 = (TCGTemp *)pTVar2->args[1];
    uVar15 = *(ulong *)pTVar3;
    cVar27 = (char)(uVar15 >> 8);
    if (cVar27 != '\x03') {
      pTVar6 = s->tcg_op_defs[0x8b].args_ct;
      uVar36 = pTVar6[1].u.regs;
      uVar30 = uVar15;
      if (((uint)*(ulong *)pTVar32 & 0xff00) != 0x100) {
        uVar23 = 1 << ((byte)uVar15 & 0x1f);
        if (cVar27 != '\x01' || (TVar28 & 0x80000) != INDEX_op_discard) {
          uVar23 = 0;
        }
        TVar12 = tcg_reg_alloc(s,(pTVar6->u).regs,uVar23 | s->reserved_regs,pTVar2->output_pref[0],
                               (*(ulong *)pTVar32 & 0x400000000) != 0);
        *(ulong *)pTVar32 =
             (*(ulong *)pTVar32 & 0xfffffff7ffff0000) + (ulong)(TVar12 & 0xff) + 0x100;
        s->reg_to_temp[TVar12 & 0xff] = pTVar32;
        uVar30 = *(ulong *)pTVar3;
      }
      uVar23 = TVar28 >> 0xc & 0xf;
      TVar48 = (TVar28 >> 8 & 0xf) + TCG_TYPE_V64;
      if ((char)(uVar30 >> 8) == '\x01') {
        TVar12 = (TCGReg)uVar30 & 0xff;
        if ((uVar36 >> ((TCGReg)uVar30 & TCG_REG_XMM15) & 1) == 0) {
          bVar22 = (byte)*(undefined8 *)pTVar32;
          if ((uVar30 >> 0x23 & 1) != 0) goto LAB_008b704c;
          tcg_out_mov(s,(TCGType_conflict)(uVar15 >> 0x18) & 0xff,
                      (TCGReg)*(undefined8 *)pTVar32 & 0xff,TVar12);
          bVar22 = *(byte *)pTVar32;
          TVar12 = (TCGReg)bVar22;
        }
        else {
          bVar22 = *(byte *)pTVar32;
        }
        tcg_out_dup_vec(s,TVar48,uVar23,(uint)bVar22,TVar12);
      }
      else {
        if (((uint)(uVar30 >> 8) & 0xff) != 2) {
          pcVar14 = 
          "/workspace/llm4binary/github/license_c_cmakelists/AFLplusplus[P]unicornafl/unicorn/qemu/tcg/tcg.c"
          ;
          iVar50 = 0xd22;
          goto LAB_008b854c;
        }
        bVar22 = (byte)*(undefined8 *)pTVar32;
LAB_008b704c:
        tcg_out_dupm_vec(s,TVar48,uVar23,(uint)bVar22,(uint)*(byte *)pTVar3->mem_base,
                         pTVar3->mem_offset);
      }
      if ((TVar28 >> 0x13 & 1) != 0) {
        temp_dead(s,pTVar3);
      }
      if ((TVar28 >> 0x10 & 1) != 0) {
        temp_sync(s,pTVar32,s->reserved_regs,0,0);
      }
      if ((TVar28 >> 0x12 & 1) != 0) goto LAB_008b655e;
      goto LAB_008b6e2e;
    }
    val = pTVar3->val;
    if ((TVar28 >> 0x13 & 1) != 0) {
      temp_dead(s,pTVar3);
    }
    TVar29 = pTVar2->output_pref[0];
LAB_008b6e24:
    tcg_reg_alloc_do_movi(s,pTVar32,val,arg_life,TVar29);
    goto LAB_008b6e2e;
  }
  iVar13 = 0x402f7;
  TVar39 = 0xf7;
  TVar49 = TCG_TYPE_I32;
  rexw = TCG_TYPE_I32;
  TVar44 = TCG_TYPE_I32;
  TVar43 = TCG_TYPE_I32;
  TVar45 = TCG_TYPE_I32;
  _small = (&switchD_008b6ebf::switchdataD_00baf7c0)[uVar46] + 0xbaf7c0;
  tVar53 = (tcg_insn_unit)new_args[0];
  uVar15 = new_args[1];
  switch(uVar23 & 0xff) {
  case 3:
    uVar23 = 0xffffffff;
    pTVar33 = (TCGLabel *)new_args[0];
    goto LAB_008b7e51;
  case 4:
    if ((new_args[0] & 2) != 0) {
      ptVar21 = s->code_ptr;
      s->code_ptr = ptVar21 + 1;
      *ptVar21 = 0xf0;
      tcg_out_modrm_offset(s,0x83,1,4,0);
      ptVar21 = s->code_ptr;
      s->code_ptr = ptVar21 + 1;
      *ptVar21 = '\0';
    }
    break;
  default:
    goto switchD_008b6ebf_caseD_5;
  case 7:
    iVar50 = 0;
    goto LAB_008b79ac;
  case 8:
    tcg_out_cmp(s,new_args[1] & 0xffffffff,new_args[2],local_78[2],0);
    TVar49 = TCG_TYPE_I32;
    goto LAB_008b7d45;
  case 9:
  case 0x43:
    iVar50 = 0x1b6;
    goto LAB_008b7c44;
  case 10:
    iVar50 = 0x1be;
    goto LAB_008b7c44;
  case 0xb:
  case 0x45:
    iVar50 = 0x1b7;
    goto LAB_008b7c44;
  case 0xc:
    iVar50 = 0x1bf;
    goto LAB_008b7c44;
  case 0xd:
  case 0x47:
    TVar38 = TCG_TYPE_I32;
    goto LAB_008b7dc4;
  case 0xe:
  case 0x4a:
    if (local_78[0] == 0) {
      iVar50 = 0x2088;
      goto LAB_008b7c44;
    }
    tcg_out_modrm_offset(s,0xc6,0,base,new_args[2]);
    ptVar21 = s->code_ptr;
    s->code_ptr = ptVar21 + 1;
    *ptVar21 = tVar53;
    break;
  case 0xf:
  case 0x4b:
    if (local_78[0] == 0) {
      iVar50 = 0x489;
      goto LAB_008b7c44;
    }
    tcg_out_modrm_offset(s,0x4c7,0,base,new_args[2]);
    ptVar21 = s->code_ptr;
    *(short *)ptVar21 = (short)TVar37;
    pTVar20 = (TCGType_conflict *)(ptVar21 + 2);
    goto LAB_008b80fa;
  case 0x10:
  case 0x4c:
    if (local_78[0] != 0) {
      iVar50 = 199;
      goto LAB_008b7d82;
    }
    TVar38 = TCG_TYPE_I32;
LAB_008b8202:
    tcg_out_st(s,TVar38,r,base,new_args[2]);
    break;
  case 0x11:
    goto switchD_008b6ebf_caseD_11;
  case 0x12:
    goto switchD_008b6ebf_caseD_12;
  case 0x13:
    goto switchD_008b6ebf_caseD_13;
  case 0x18:
    goto switchD_008b6ebf_caseD_18;
  case 0x19:
    goto switchD_008b6ebf_caseD_19;
  case 0x1a:
    iVar50 = 4;
    goto LAB_008b7dd7;
  case 0x1b:
    iVar50 = 1;
    TVar45 = TVar43;
    goto LAB_008b7dd7;
  case 0x1c:
    iVar50 = 6;
    TVar45 = TVar43;
    goto LAB_008b7dd7;
  case 0x1d:
    goto switchD_008b6ebf_caseD_1d;
  case 0x1e:
    goto switchD_008b6ebf_caseD_1e;
  case 0x1f:
    goto switchD_008b6ebf_caseD_1f;
  case 0x20:
    goto switchD_008b6ebf_caseD_20;
  case 0x21:
    TVar49 = TCG_TYPE_I64;
switchD_008b6ebf_caseD_20:
    TVar39 = TCG_TYPE_I32;
    goto LAB_008b7f13;
  case 0x22:
  case 0x5f:
    if (CONCAT44(new_args[3]._4_4_,(TCGType_conflict)new_args[3]) != 8) {
      if (CONCAT44(new_args[3]._4_4_,(TCGType_conflict)new_args[3]) == 0) {
        if (CONCAT44(new_args[4]._4_4_,(TCGType_conflict)new_args[4]) == 0x10) {
          TVar39 = 0x489;
          r = TVar48;
        }
        else {
          if (CONCAT44(new_args[4]._4_4_,(TCGType_conflict)new_args[4]) != 8) goto LAB_008b8561;
          TVar39 = 0x6088;
          r = TVar48;
        }
        goto LAB_008b8139;
      }
LAB_008b8561:
      pcVar14 = 
      "/workspace/llm4binary/github/license_c_cmakelists/AFLplusplus[P]unicornafl/unicorn/qemu/tcg/i386/tcg-target.inc.c"
      ;
      uVar26 = 0xa22;
      goto LAB_008b8515;
    }
    if (CONCAT44(new_args[4]._4_4_,(TCGType_conflict)new_args[4]) != 8) goto LAB_008b8561;
    TVar37 = (TCGArg)(r + TCG_TYPE_V256);
    TVar39 = 0x88;
    r = TVar48;
    goto LAB_008b8139;
  case 0x23:
switchD_008b6ebf_caseD_23:
    if (new_args[0] < 8 && new_args[1] < 4) {
      TVar39 = 0x1b6;
      uVar15 = (ulong)(base | TCG_TYPE_V256);
      goto LAB_008b7d5c;
    }
    tcg_out_ext16u(s,r,base);
    iVar50 = 5;
LAB_008b811d:
    TVar48 = 8;
    goto LAB_008b8127;
  case 0x24:
    if (7 < new_args[0] || 3 < new_args[1]) {
      tcg_out_modrm(s,0x1bf,r,base);
      iVar50 = 7;
      goto LAB_008b811d;
    }
    TVar39 = 0x1be;
    uVar15 = (ulong)(base | TCG_TYPE_V256);
    goto LAB_008b7d5c;
  case 0x25:
    iVar50 = 0x1ac;
    goto LAB_008b795f;
  case 0x26:
    iVar50 = 0;
    goto LAB_008b7e35;
  case 0x27:
    goto switchD_008b6ebf_caseD_27;
  case 0x28:
    goto switchD_008b6ebf_caseD_28;
  case 0x29:
    goto switchD_008b6ebf_caseD_29;
  case 0x2a:
    goto switchD_008b6ebf_caseD_2a;
  case 0x2f:
    goto switchD_008b6ebf_caseD_2f;
  case 0x30:
    goto switchD_008b6ebf_caseD_30;
  case 0x31:
  case 0x6b:
    goto LAB_008b79dd;
  case 0x32:
  case 0x6c:
    tcg_out_ext16u(s,r,base);
    break;
  case 0x33:
  case 0x6e:
    tcg_out_rolw_8(s,r);
    break;
  case 0x34:
  case 0x6f:
    tcg_out_bswap32(s,r);
    break;
  case 0x35:
    goto switchD_008b6ebf_caseD_35;
  case 0x36:
    goto switchD_008b6ebf_caseD_36;
  case 0x37:
    TVar39 = TCG_TYPE_I32;
    goto LAB_008b7b6c;
  case 0x3c:
    tStackY_180 = 0x1f;
    goto LAB_008b7c97;
  case 0x3d:
    goto switchD_008b6ebf_caseD_3d;
  case 0x3e:
    TVar39 = 0x201b8;
    goto LAB_008b7d5c;
  case 0x41:
    iVar50 = 0x1000;
LAB_008b79ac:
    uVar15 = (ulong)(TCGType_conflict)new_args[3];
    tcg_out_cmp(s,new_args[1],new_args[2],local_78[2],iVar50);
    tcg_out_modrm(s,""[uVar15] | 0x4190,0,r);
    base = r;
LAB_008b79dd:
    tcg_out_ext8u(s,r,base);
    break;
  case 0x42:
    tcg_out_cmp(s,new_args[1] & 0xffffffff,new_args[2],local_78[2],0x1000);
    TVar49 = 0x1000;
    goto LAB_008b7d45;
  case 0x44:
    iVar50 = 0x11be;
    goto LAB_008b7c44;
  case 0x46:
    iVar50 = 0x11bf;
    goto LAB_008b7c44;
  case 0x48:
    iVar50 = 0x1063;
LAB_008b7c44:
    tcg_out_modrm_offset(s,iVar50,r,base,new_args[2]);
    break;
  case 0x49:
    TVar38 = TCG_TYPE_I64;
LAB_008b7dc4:
    tcg_out_ld(s,TVar38,r,base,new_args[2]);
    break;
  case 0x4d:
    if (local_78[0] == 0) {
      TVar38 = TCG_TYPE_I64;
      goto LAB_008b8202;
    }
    iVar50 = 0x10c7;
LAB_008b7d82:
    tcg_out_modrm_offset(s,iVar50,0,base,new_args[2]);
    pTVar20 = (TCGType_conflict *)s->code_ptr;
    *pTVar20 = r;
    goto LAB_008b80f6;
  case 0x4e:
    TVar49 = 0x1000;
switchD_008b6ebf_caseD_11:
    iVar50 = 0;
    TVar45 = TVar49;
    if (new_args[0] == new_args[1]) goto LAB_008b7dd7;
    if (local_78[2] != 0) {
      uVar15 = 0xffffffffffffffff;
LAB_008b826a:
      TVar49 = TVar49 | 0x8d;
      TVar37 = uVar15 & 0xffffffff;
LAB_008b8284:
      TVar42 = 0;
LAB_008b8287:
      tcg_out_modrm_sib_offset(s,TVar49,r,base,(int)TVar37,(int)TVar42,TVar60);
      break;
    }
    if (new_args[0] != new_args[2]) {
      TVar60 = 0;
      uVar15 = new_args[2];
      goto LAB_008b826a;
    }
    uVar15 = new_args[1] & 0xffffffff;
    base = r;
    goto LAB_008b804d;
  case 0x4f:
    TVar44 = 0x1000;
switchD_008b6ebf_caseD_12:
    iVar50 = 5;
    TVar45 = TVar44;
    goto LAB_008b7dd7;
  case 0x50:
    TVar43 = 0x1000;
switchD_008b6ebf_caseD_13:
    if (local_78[2] != 0) {
      if (TVar48 == (int)(char)tVar9) {
        tcg_out_modrm(s,TVar43 | 0x6b,r,r);
        ptVar21 = s->code_ptr;
        s->code_ptr = ptVar21 + 1;
        *ptVar21 = tVar9;
      }
      else {
        tcg_out_modrm(s,TVar43 | 0x69,r,r);
        pTVar20 = (TCGType_conflict *)s->code_ptr;
        *pTVar20 = TVar48;
LAB_008b80f6:
        pTVar20 = pTVar20 + 1;
LAB_008b80fa:
        s->code_ptr = (tcg_insn_unit *)pTVar20;
      }
      break;
    }
    TVar39 = TVar43 | 0x1af;
    goto LAB_008b813c;
  case 0x55:
    TVar39 = 0x10f7;
switchD_008b6ebf_caseD_18:
    r = TCG_TYPE_V256|TCG_TYPE_V128;
    TVar48 = (TCGType_conflict)new_args[4];
    goto LAB_008b813c;
  case 0x56:
    TVar39 = 0x10f7;
switchD_008b6ebf_caseD_19:
    r = TCG_TYPE_V256|TCG_TYPE_V64;
    TVar48 = (TCGType_conflict)new_args[4];
    goto LAB_008b813c;
  case 0x57:
    iVar50 = 4;
    goto LAB_008b7b5e;
  case 0x58:
    iVar50 = 1;
    goto LAB_008b7b5e;
  case 0x59:
    iVar50 = 6;
LAB_008b7b5e:
    TVar45 = 0x1000;
LAB_008b7dd7:
    TVar49 = TVar45 + iVar50;
    uVar15 = new_args[2];
    if (local_78[2] == 0) {
      uVar15 = new_args[2] & 0xffffffff;
      base = r;
LAB_008b804d:
      tgen_arithr(s,TVar49,base,(int)uVar15);
    }
    else {
LAB_008b7def:
      iVar50 = 0;
LAB_008b7df2:
      tgen_arithi(s,TVar49,r,uVar15,iVar50);
    }
    break;
  case 0x5a:
    TVar49 = 0x1000;
switchD_008b6ebf_caseD_1d:
    iVar13 = 0x6f7;
    TVar39 = TVar49;
    TVar38 = TCG_TYPE_V256;
    if ((new_args[0] == new_args[1] || local_78[2] == 0) || (2 < new_args[2] - 1)) {
LAB_008b7ecf:
      TVar49 = TVar38;
      if (have_bmi2 != true) {
LAB_008b7f13:
        if (local_78[2] == 0) {
          TVar39 = TVar39 + 0xd3;
          r = TVar49;
          goto LAB_008b8139;
        }
LAB_008b7f1f:
        iVar50 = TVar49 + TVar39;
        goto LAB_008b8127;
      }
      if (local_78[2] != 0) {
        tcg_out_mov(s,(uint)(TVar39 != TCG_TYPE_I32),r,base);
        goto LAB_008b7f1f;
      }
      TVar39 = TVar39 + iVar13;
      goto LAB_008b767c;
    }
    TVar49 = TVar49 | 0x8d;
    TVar37 = new_args[1];
    if (new_args[2] == 1) {
      TVar60 = 0;
      goto LAB_008b8284;
    }
    TVar60 = 0;
    base = ~TCG_TYPE_I32;
    TVar42 = new_args[2];
    goto LAB_008b8287;
  case 0x5b:
    TVar49 = 0x1000;
switchD_008b6ebf_caseD_1e:
    TVar39 = TVar49;
    TVar38 = TCG_TYPE_COUNT;
    goto LAB_008b7ecf;
  case 0x5c:
    TVar49 = 0x1000;
switchD_008b6ebf_caseD_1f:
    iVar13 = 0x202f7;
    TVar39 = TVar49;
    TVar38 = TCG_TYPE_V256|TCG_TYPE_V128;
    goto LAB_008b7ecf;
  case 0x5d:
    goto switchD_008b6ebf_caseD_5d;
  case 0x5e:
    TVar49 = TCG_TYPE_I64;
switchD_008b6ebf_caseD_5d:
    TVar39 = 0x1000;
    goto LAB_008b7f13;
  case 0x60:
    if (CONCAT44(new_args[3]._4_4_,(TCGType_conflict)new_args[3]) + new_args[2] != 0x20)
    goto switchD_008b6ebf_caseD_23;
    tcg_out_mov(s,TCG_TYPE_I32,r,base);
    iVar50 = 5;
    goto LAB_008b8127;
  case 0x62:
    iVar50 = 0x11ac;
LAB_008b795f:
    tcg_out_modrm(s,iVar50,TVar48,r);
    tVar9 = (tcg_insn_unit)new_args[3];
LAB_008b7979:
    ptVar21 = s->code_ptr;
    s->code_ptr = ptVar21 + 1;
    *ptVar21 = tVar9;
    break;
  case 99:
  case 0x6a:
    tcg_out_ext32s(s,r,base);
    break;
  case 100:
  case 0x65:
  case 0x6d:
    tcg_out_ext32u(s,r,base);
    break;
  case 0x66:
    TVar48 = 0x20;
    iVar50 = 0x1005;
LAB_008b8127:
    tcg_out_shifti(s,iVar50,r,TVar48);
    break;
  case 0x67:
    iVar50 = 0x1000;
LAB_008b7e35:
    pTVar33 = (TCGLabel *)CONCAT44(new_args[3]._4_4_,(TCGType_conflict)new_args[3]);
    tcg_out_cmp(s,new_args[0],new_args[1],local_78[1],iVar50);
    _small = 0xbafbe8;
    uVar23 = (uint)""[TVar60 & 0xffffffff];
LAB_008b7e51:
    tcg_out_jxx(s,uVar23,pTVar33,_small);
    break;
  case 0x68:
    TVar49 = 0x1000;
switchD_008b6ebf_caseD_2f:
    tcg_out_ext8s(s,r,base,TVar49);
    break;
  case 0x69:
    rexw = 0x1000;
switchD_008b6ebf_caseD_30:
    tcg_out_ext16s(s,r,base,rexw);
    break;
  case 0x70:
    tcg_out_bswap64(s,r);
    break;
  case 0x71:
    TVar39 = 0x10f7;
switchD_008b6ebf_caseD_35:
    r = TCG_TYPE_V64;
    goto LAB_008b8139;
  case 0x72:
    TVar39 = 0x10f7;
switchD_008b6ebf_caseD_36:
    r = TCG_TYPE_V128;
    goto LAB_008b8139;
  case 0x73:
    TVar39 = 0x1000;
    TVar49 = TCG_TYPE_I64;
LAB_008b7b6c:
    if (local_78[2] == 0) {
      TVar39 = TVar39 | 0x2f2;
      goto LAB_008b767c;
    }
    tcg_out_mov(s,TVar49,r,base);
    TVar49 = TVar39 | TCG_TYPE_V256;
    uVar15 = ~TVar60;
    goto LAB_008b7def;
  case 0x78:
    TVar49 = 0x1000;
    tStackY_180 = 0x3f;
LAB_008b7c97:
    if (have_lzcnt == true) {
      TVar38 = TVar49 | 0x201bd;
LAB_008b7cb0:
      tcg_out_modrm(s,TVar38,r,base);
      if (iVar50 != 0) break;
      cond = TCG_COND_LTU;
      TVar38 = TVar48;
    }
    else {
      tcg_out_modrm(s,TVar49 | 0x1bd,r,base);
      tgen_arithi(s,TVar49 | (TCG_TYPE_V256|TCG_TYPE_V64),r,tStackY_180,0);
      TVar39 = TVar49 | 0x85;
      TVar38 = base;
LAB_008b7d2f:
      tcg_out_modrm(s,TVar39,TVar38,base);
      cond = TCG_COND_EQ;
      TVar38 = TVar48;
    }
LAB_008b7d45:
    tcg_out_cmov(s,cond,TVar49,r,TVar38);
    break;
  case 0x79:
    TVar49 = 0x1000;
switchD_008b6ebf_caseD_3d:
    if (have_bmi1_sparc != true) {
      TVar39 = TVar49 | 0x1bc;
      TVar38 = r;
      goto LAB_008b7d2f;
    }
    TVar38 = TVar49 | 0x201bc;
    goto LAB_008b7cb0;
  case 0x7a:
    TVar39 = 0x211b8;
LAB_008b7d5c:
    TVar48 = (TCGType_conflict)uVar15;
    goto LAB_008b813c;
  case 0x7b:
    rexw = 0x1000;
switchD_008b6ebf_caseD_27:
    if (local_68 == 0) {
      tgen_arithr(s,rexw,r,(TCGType_conflict)new_args[4]);
    }
    else {
      tgen_arithi(s,rexw,r,CONCAT44(new_args[4]._4_4_,(TCGType_conflict)new_args[4]),1);
    }
    TVar49 = rexw | TCG_TYPE_V64;
    uVar15 = CONCAT44(new_args[5]._4_4_,(TCGCond)new_args[5]);
    if (local_64 != 0) {
      iVar50 = 1;
      r = base;
      goto LAB_008b7df2;
    }
    goto LAB_008b804d;
  case 0x7c:
    TVar43 = 0x1000;
switchD_008b6ebf_caseD_28:
    if (local_68 == 0) {
      tgen_arithr(s,TVar43 | TCG_TYPE_COUNT,r,(TCGType_conflict)new_args[4]);
    }
    else {
      tgen_arithi(s,TVar43 | TCG_TYPE_COUNT,r,
                  CONCAT44(new_args[4]._4_4_,(TCGType_conflict)new_args[4]),1);
    }
    TVar49 = TVar43 | TCG_TYPE_V128;
    uVar15 = CONCAT44(new_args[5]._4_4_,(TCGCond)new_args[5]);
    if (local_64 != 0) {
      iVar50 = 1;
      r = base;
      goto LAB_008b7df2;
    }
    goto LAB_008b804d;
  case 0x7d:
    TVar39 = 0x10f7;
switchD_008b6ebf_caseD_29:
    r = TCG_TYPE_V256;
    TVar48 = (TCGType_conflict)new_args[3];
    goto LAB_008b813c;
  case 0x7e:
    TVar39 = 0x10f7;
switchD_008b6ebf_caseD_2a:
    r = TCG_TYPE_COUNT;
    TVar48 = (TCGType_conflict)new_args[3];
    goto LAB_008b813c;
  case 0x82:
    if (new_args[0] == 0) {
      ptVar21 = (tcg_insn_unit *)s->code_gen_epilogue;
    }
    else {
      tcg_out_movi(s,TCG_TYPE_I64,TCG_REG_EAX,new_args[0]);
      ptVar21 = (tcg_insn_unit *)s->tb_ret_addr;
    }
    tcg_out_jmp(s,ptVar21);
    break;
  case 0x83:
    if (s->tb_jmp_insn_offset == (uintptr_t *)0x0) {
      tcg_out_modrm_offset(s,0xff,4,-1,(intptr_t)(s->tb_jmp_target_addr + new_args[0]));
      ptVar21 = s->code_ptr;
    }
    else {
      ptVar21 = s->code_ptr;
      iVar50 = (int)ptVar21;
      if ((iVar50 + 4U & 0xfffffffc) - iVar50 != 1) {
        for (iVar50 = (iVar50 - (iVar50 + 4U & 0xfffffffc)) + 2; s->code_ptr = ptVar21 + 1,
            iVar50 != 0; iVar50 = iVar50 + 1) {
          *ptVar21 = 'f';
          ptVar21 = s->code_ptr;
        }
        *ptVar21 = 0x90;
        ptVar21 = s->code_ptr;
      }
      s->code_ptr = ptVar21 + 1;
      *ptVar21 = 0xe9;
      ptVar21 = s->code_ptr;
      s->tb_jmp_insn_offset[new_args[0]] = (long)ptVar21 - (long)s->code_buf;
      ptVar21[0] = '\0';
      ptVar21[1] = '\0';
      ptVar21[2] = '\0';
      ptVar21[3] = '\0';
      ptVar21 = ptVar21 + 4;
      s->code_ptr = ptVar21;
    }
    uVar15 = (long)ptVar21 - (long)s->code_buf;
    s->tb_jmp_reset_offset[(int)r] = (uint16_t)uVar15;
    if (0xffff < uVar15) {
      __assert_fail("s->tb_jmp_reset_offset[which] == off",
                    "/workspace/llm4binary/github/license_c_cmakelists/AFLplusplus[P]unicornafl/unicorn/qemu/tcg/tcg.c"
                    ,0x123,"void set_jmp_reset_offset(TCGContext *, int)");
    }
    break;
  case 0x84:
    TVar39 = 0xff;
    r = TCG_TYPE_V256;
LAB_008b8139:
    TVar48 = (TCGType_conflict)TVar37;
LAB_008b813c:
    tcg_out_modrm(s,TVar39,r,TVar48);
    break;
  case 0x85:
    _Var10 = false;
    goto LAB_008b7f6c;
  case 0x86:
    _Var10 = false;
    goto LAB_008b7f85;
  case 0x87:
    _Var10 = true;
LAB_008b7f6c:
    tcg_out_qemu_ld(s,new_args,_Var10);
    break;
  case 0x88:
    _Var10 = true;
LAB_008b7f85:
    tcg_out_qemu_st(s,new_args,_Var10);
  }
LAB_008b8141:
  for (uVar15 = 0; uVar30 != uVar15; uVar15 = uVar15 + 1) {
    uVar23 = 4 << ((byte)uVar15 & 0x1f) & uVar36;
    if ((uVar36 >> ((uint)uVar15 & 0x1f) & 1) == 0) {
      if (uVar23 != 0) {
        temp_dead(s,(TCGTemp *)pTVar2->args[uVar15]);
      }
    }
    else {
      temp_sync(s,(TCGTemp *)pTVar2->args[uVar15],TVar29,0,uVar23);
    }
  }
LAB_008b6e2e:
  if (s->code_gen_highwater < s->code_ptr) {
    return -1;
  }
  paVar47 = &pTVar2->link;
  if (0xffff < (ulong)((long)s->code_ptr - (long)s->code_buf)) {
    return -2;
  }
  goto LAB_008b64f6;
LAB_008b82c3:
  pTVar7 = paVar52->sqh_first;
  if (pTVar7 == (TCGLabelQemuLdst *)0x0) {
    iVar50 = tcg_out_pool_finalize(s);
    if (iVar50 < 0) {
      return iVar50;
    }
    paVar35 = &s->labels;
    do {
      pTVar33 = paVar35->sqh_first;
      if (pTVar33 == (TCGLabel *)0x0) {
        return *(int *)&s->code_ptr - *(int *)&s->code_buf;
      }
      value = (pTVar33->u).value;
      pTVar57 = (TCGRelocation *)&pTVar33->relocs;
      while (pTVar57 = (pTVar57->next).sqe_next, pTVar57 != (TCGRelocation *)0x0) {
        _Var10 = patch_reloc(pTVar57->ptr,pTVar57->type,value,pTVar57->addend);
        if (!_Var10) {
          return -2;
        }
      }
      paVar35 = (anon_struct_16_2_9a852307_for_labels *)&pTVar33->next;
    } while( true );
  }
  uVar36 = pTVar7->oi;
  uVar23 = uVar36 >> 4;
  if (pTVar7->is_ld != true) {
    *(int *)pTVar7->label_ptr[0] = ((int)ptVar21 - (int)pTVar7->label_ptr[0]) + -4;
    tcg_out_modrm(s,0x108b,7,5);
    tcg_out_mov(s,(uint)((~uVar36 & 0x30) == 0),TCG_REG_EDX,pTVar7->datalo_reg);
    tcg_out_movi(s,TCG_TYPE_I32,TCG_REG_ECX,(ulong)uVar36);
    tcg_out_movi(s,TCG_TYPE_I64,TCG_REG_R8,(tcg_target_long)pTVar7->raddr);
    tcg_out_push(s,8);
    pptVar56 = (tcg_insn_unit **)(qemu_st_helpers + (uVar23 & 0xb));
    goto LAB_008b8412;
  }
  iVar50 = (uint)(pTVar7->type == TCG_TYPE_I64) << 0xc;
  *(int *)pTVar7->label_ptr[0] = ((int)ptVar21 - (int)pTVar7->label_ptr[0]) + -4;
  tcg_out_modrm(s,0x108b,7,5);
  tcg_out_movi(s,TCG_TYPE_I32,TCG_REG_EDX,(ulong)uVar36);
  pptVar56 = &pTVar7->raddr;
  tcg_out_movi(s,TCG_TYPE_I64,TCG_REG_ECX,(tcg_target_long)pTVar7->raddr);
  tcg_out_call(s,(tcg_insn_unit *)qemu_ld_helpers[uVar23 & 0xb]);
  TVar12 = pTVar7->datalo_reg;
  switch(uVar23 & 7) {
  default:
    TVar48 = TCG_TYPE_I32;
    goto LAB_008b8404;
  case 3:
    TVar48 = TCG_TYPE_I64;
LAB_008b8404:
    tcg_out_mov(s,TVar48,TVar12,TCG_REG_EAX);
    break;
  case 4:
    tcg_out_ext8s(s,TVar12,0,iVar50);
    break;
  case 5:
    tcg_out_ext16s(s,TVar12,0,iVar50);
    break;
  case 6:
    tcg_out_ext32s(s,TVar12,0);
    break;
  case 7:
    pcVar14 = 
    "/workspace/llm4binary/github/license_c_cmakelists/AFLplusplus[P]unicornafl/unicorn/qemu/tcg/i386/tcg-target.inc.c"
    ;
    uVar26 = 0x768;
LAB_008b8515:
    fprintf(_stderr,"%s:%d: tcg fatal error\n",pcVar14,uVar26);
    abort();
  }
LAB_008b8412:
  tcg_out_jmp(s,*pptVar56);
  ptVar21 = s->code_ptr;
  paVar52 = (anon_struct_16_2_9a852307_for_ldst_labels *)&pTVar7->next;
  if (s->code_gen_highwater < ptVar21) {
    return -1;
  }
  goto LAB_008b82c3;
}

Assistant:

int tcg_gen_code(TCGContext *s, TranslationBlock *tb)
{
    int i, num_insns;
    TCGOp *op;

#ifndef NDEBUG
    if (getenv("UNICORN_DEBUG")) {
        tcg_dump_ops(s, false, "TCG before optimization:");
    }
#endif

#ifdef CONFIG_DEBUG_TCG
    /* Ensure all labels referenced have been emitted.  */
    {
        TCGLabel *l;
        bool error = false;

        QSIMPLEQ_FOREACH(l, &s->labels, next) {
            if (unlikely(!l->present) && l->refs) {
                error = true;
            }
        }
        assert(!error);
    }
#endif

#ifdef USE_TCG_OPTIMIZATIONS
    tcg_optimize(s);
#endif
    //tcg_dump_ops(s, false, "after opt1:");
    reachable_code_pass(s);
    //tcg_dump_ops(s, false, "after opt2:");
    liveness_pass_1(s);
    //tcg_dump_ops(s, false, "after opt3:");
    if (s->nb_indirects > 0) {
        /* Replace indirect temps with direct temps.  */
        if (liveness_pass_2(s)) {
            /* If changes were made, re-run liveness.  */
            liveness_pass_1(s);
        }
    }
    //tcg_dump_ops(s, false, "after opt4:");
    tcg_reg_alloc_start(s);

    s->code_buf = tb->tc.ptr;
    s->code_ptr = tb->tc.ptr;

#ifdef TCG_TARGET_NEED_LDST_LABELS
    QSIMPLEQ_INIT(&s->ldst_labels);
#endif
#ifdef TCG_TARGET_NEED_POOL_LABELS
    s->pool_labels = NULL;
#endif

#ifndef NDEBUG
    if (getenv("UNICORN_DEBUG")) {
        tcg_dump_ops(s, false, "TCG before codegen:");
    }
#endif
    num_insns = -1;
    QTAILQ_FOREACH(op, &s->ops, link) {
        TCGOpcode opc = op->opc;

        switch (opc) {
        case INDEX_op_mov_i32:
        case INDEX_op_mov_i64:
        case INDEX_op_mov_vec:
            tcg_reg_alloc_mov(s, op);
            break;
        case INDEX_op_movi_i32:
        case INDEX_op_movi_i64:
        case INDEX_op_dupi_vec:
            tcg_reg_alloc_movi(s, op);
            break;
        case INDEX_op_dup_vec:
            tcg_reg_alloc_dup(s, op);
            break;
        case INDEX_op_insn_start:
            if (num_insns >= 0) {
                size_t off = tcg_current_code_size(s);
                s->gen_insn_end_off[num_insns] = off;
                /* Assert that we do not overflow our stored offset.  */
                assert(s->gen_insn_end_off[num_insns] == off);
            }
            num_insns++;
            for (i = 0; i < TARGET_INSN_START_WORDS; ++i) {
                target_ulong a;
#if TARGET_LONG_BITS > TCG_TARGET_REG_BITS
                a = deposit64(op->args[i * 2], 32, 32, op->args[i * 2 + 1]);
#else
                a = op->args[i];
#endif
                s->gen_insn_data[num_insns][i] = a;
            }
            break;
        case INDEX_op_discard:
            temp_dead(s, arg_temp(op->args[0]));
            break;
        case INDEX_op_set_label:
            tcg_reg_alloc_bb_end(s, s->reserved_regs);
            tcg_out_label(s, arg_label(op->args[0]), s->code_ptr);
            break;
        case INDEX_op_call:
            tcg_reg_alloc_call(s, op);
            break;
        default:
            /* Sanity check that we've not introduced any unhandled opcodes. */
            tcg_debug_assert(tcg_op_supported(opc));
            /* Note: in order to speed up the code, it would be much
               faster to have specialized register allocator functions for
               some common argument patterns */
            tcg_reg_alloc_op(s, op);
            break;
        }
#ifdef CONFIG_DEBUG_TCG
        check_regs(s);
#endif

        /* Test for (pending) buffer overflow.  The assumption is that any
           one operation beginning below the high water mark cannot overrun
           the buffer completely.  Thus we can test for overflow after
           generating code without having to check during generation.  */
        if (unlikely((void *)s->code_ptr > s->code_gen_highwater)) {
            return -1;
        }
        /* Test for TB overflow, as seen by gen_insn_end_off.  */
        if (unlikely(tcg_current_code_size(s) > UINT16_MAX)) {
            return -2;
        }
    }
    tcg_debug_assert(num_insns >= 0);
    s->gen_insn_end_off[num_insns] = tcg_current_code_size(s);

    /* Generate TB finalization at the end of block */
#ifdef TCG_TARGET_NEED_LDST_LABELS
    i = tcg_out_ldst_finalize(s);
    if (i < 0) {
        return i;
    }
#endif
#ifdef TCG_TARGET_NEED_POOL_LABELS
    i = tcg_out_pool_finalize(s);
    if (i < 0) {
        return i;
    }
#endif
    if (!tcg_resolve_relocs(s)) {
        return -2;
    }

    /* flush instruction cache */
    flush_icache_range((uintptr_t)s->code_buf, (uintptr_t)s->code_ptr);

    return tcg_current_code_size(s);
}